

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void DiscardContainer(TidyDocImpl *doc,Node *element,Node **pnode)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node **ppNVar4;
  
  pNVar3 = element->content;
  if (pNVar3 != (Node *)0x0) {
    pNVar1 = element->parent;
    pNVar2 = element->last;
    pNVar2->next = element->next;
    ppNVar4 = &element->next->prev;
    if (element->next == (Node *)0x0) {
      ppNVar4 = &pNVar1->last;
    }
    *ppNVar4 = pNVar2;
    if (element->prev == (Node *)0x0) {
      ppNVar4 = &pNVar1->content;
    }
    else {
      pNVar3->prev = element->prev;
      ppNVar4 = &element->prev->next;
    }
    *ppNVar4 = pNVar3;
    for (pNVar3 = element->content; pNVar3 != (Node *)0x0; pNVar3 = pNVar3->next) {
      pNVar3->parent = pNVar1;
    }
    *pnode = element->content;
    element->next = (Node *)0x0;
    element->content = (Node *)0x0;
    prvTidyFreeNode(doc,element);
    return;
  }
  pNVar3 = prvTidyDiscardElement(doc,element);
  *pnode = pNVar3;
  return;
}

Assistant:

static void DiscardContainer( TidyDocImpl* doc, Node *element, Node **pnode)
{
    if (element->content)
    {
        Node *node, *parent = element->parent;

        element->last->next = element->next;

        if (element->next)
        {
            element->next->prev = element->last;
        }
        else
            parent->last = element->last;

        if (element->prev)
        {
            element->content->prev = element->prev;
            element->prev->next = element->content;
        }
        else
            parent->content = element->content;

        for (node = element->content; node; node = node->next)
            node->parent = parent;

        *pnode = element->content;

        element->next = element->content = NULL;
        TY_(FreeNode)(doc, element);
    }
    else
    {
        *pnode = TY_(DiscardElement)(doc, element);
    }
}